

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 HashmapCmpCallback4(jx9_hashmap_node *pA,jx9_hashmap_node *pB,void *pCmpData)

{
  jx9_vm *pVm;
  jx9_vm *pjVar1;
  sxi32 sVar2;
  undefined4 uVar3;
  jx9_value sResult;
  jx9_value *apArg [2];
  anon_union_8_3_18420de5_for_x local_58;
  ulong uStack_50;
  jx9_vm *local_48;
  jx9_vm *pjStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  jx9_value *local_18;
  long local_10;
  
  local_48 = pA->pMap->pVm;
  uStack_20 = 0;
  local_58.rVal = 0.0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_50 = 0x20;
  pVm = pA->pMap->pVm;
  if (pA->nValIdx < (pVm->aMemObj).nUsed) {
    local_18 = (jx9_value *)
               ((ulong)(pA->nValIdx * (pVm->aMemObj).eSize) + (long)(pVm->aMemObj).pBase);
  }
  else {
    local_18 = (jx9_value *)0x0;
  }
  pjVar1 = pB->pMap->pVm;
  if (pB->nValIdx < (pjVar1->aMemObj).nUsed) {
    local_10 = (ulong)(pB->nValIdx * (pjVar1->aMemObj).eSize) + (long)(pjVar1->aMemObj).pBase;
  }
  else {
    local_10 = 0;
  }
  pjStack_40 = local_48;
  sVar2 = jx9VmCallUserFunction(pVm,(jx9_value *)pCmpData,2,&local_18,(jx9_value *)&local_58);
  uVar3 = -1;
  if (sVar2 == 0) {
    if ((uStack_50 & 2) == 0) {
      jx9MemObjToInteger((jx9_value *)&local_58);
    }
    uVar3 = local_58.iVal._0_4_;
  }
  jx9MemObjRelease((jx9_value *)&local_58);
  return uVar3;
}

Assistant:

static sxi32 HashmapCmpCallback4(jx9_hashmap_node *pA, jx9_hashmap_node *pB, void *pCmpData)
{
	jx9_value sResult, *pCallback;
	jx9_value *pV1, *pV2;
	jx9_value *apArg[2];  /* Callback arguments */
	sxi32 rc;
	/* Point to the desired callback */
	pCallback = (jx9_value *)pCmpData;
	/* initialize the result value */
	jx9MemObjInit(pA->pMap->pVm, &sResult);
	/* Extract nodes values */
	pV1 = HashmapExtractNodeValue(pA);
	pV2 = HashmapExtractNodeValue(pB);
	apArg[0] = pV1;
	apArg[1] = pV2;
	/* Invoke the callback */
	rc = jx9VmCallUserFunction(pA->pMap->pVm, pCallback, 2, apArg, &sResult);
	if( rc != SXRET_OK ){
		/* An error occured while calling user defined function [i.e: not defined] */
		rc = -1; /* Set a dummy result */
	}else{
		/* Extract callback result */
		if((sResult.iFlags & MEMOBJ_INT) == 0 ){
			/* Perform an int cast */
			jx9MemObjToInteger(&sResult);
		}
		rc = (sxi32)sResult.x.iVal;
	}
	jx9MemObjRelease(&sResult);
	/* Callback result */
	return rc;
}